

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_indexes.cpp
# Opt level: O0

void duckdb::DuckDBIndexesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  size_type sVar1;
  reference this;
  string *psVar2;
  TableCatalogEntry *pTVar3;
  ulong uVar4;
  DataChunk *in_RDX;
  string sql;
  TableCatalogEntry *table_entry;
  idx_t col;
  IndexCatalogEntry *index;
  CatalogEntry *entry;
  idx_t count;
  DuckDBIndexesData *data;
  Value *in_stack_fffffffffffff898;
  CatalogEntry *in_stack_fffffffffffff8a0;
  DataChunk *in_stack_fffffffffffff8a8;
  ClientContext *in_stack_fffffffffffff8b0;
  IndexCatalogEntry *in_stack_fffffffffffff8b8;
  optional_idx in_stack_fffffffffffff8c0;
  undefined1 *in_stack_fffffffffffff8d8;
  undefined1 value;
  string *in_stack_fffffffffffff918;
  DataChunk *in_stack_fffffffffffff920;
  Value *this_00;
  IndexCatalogEntry *index_00;
  bool local_569;
  undefined1 local_568 [160];
  undefined1 local_4c8 [64];
  string local_488 [64];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffbb8;
  string local_3e8 [2];
  Value local_3a8 [3];
  string local_2e8 [96];
  optional_idx local_288;
  QueryErrorContext local_280;
  string local_278 [32];
  string local_258 [32];
  TableCatalogEntry *local_238;
  string local_1f0 [160];
  string local_150 [176];
  string local_a0 [96];
  ClientContext *local_40;
  IndexCatalogEntry *local_38;
  CatalogEntry *local_30;
  IndexCatalogEntry *local_28;
  DuckDBIndexesData *local_20;
  DataChunk *local_18;
  
  local_18 = in_RDX;
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->
            ((optional_ptr<duckdb::GlobalTableFunctionState,_true> *)in_stack_fffffffffffff8a0);
  local_20 = GlobalTableFunctionState::Cast<duckdb::DuckDBIndexesData>
                       ((GlobalTableFunctionState *)in_stack_fffffffffffff8a0);
  uVar4 = local_20->offset;
  sVar1 = ::std::
          vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
          ::size(&(local_20->entries).
                  super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                );
  if (uVar4 < sVar1) {
    local_28 = (IndexCatalogEntry *)0x0;
    while (uVar4 = local_20->offset,
          sVar1 = ::std::
                  vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                  ::size(&(local_20->entries).
                          super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                        ), uVar4 < sVar1 && local_28 < (IndexCatalogEntry *)0x800) {
      local_20->offset = local_20->offset + 1;
      this = vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::operator[]
                       ((vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)
                        in_stack_fffffffffffff8a0,(size_type)in_stack_fffffffffffff898);
      local_30 = ::std::reference_wrapper<duckdb::CatalogEntry>::get(this);
      local_38 = CatalogEntry::Cast<duckdb::IndexCatalogEntry>(in_stack_fffffffffffff8a0);
      local_40 = (ClientContext *)0x1;
      psVar2 = Catalog::GetName_abi_cxx11_((Catalog *)0x140cc6c);
      ::std::__cxx11::string::string(local_a0,(string *)psVar2);
      Value::Value((Value *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      ::std::__cxx11::string::~string(local_a0);
      local_40 = (ClientContext *)((long)local_40 + 1);
      Catalog::GetOid((Catalog *)0x140cd2b);
      NumericCast<long,unsigned_long,void>(0x140cd33);
      Value::BIGINT((int64_t)in_stack_fffffffffffff8d8);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      local_40 = (ClientContext *)((long)local_40 + 1);
      ::std::__cxx11::string::string
                (local_150,
                 (string *)
                 &(((local_38->super_StandardEntry).schema)->super_InCatalogEntry).
                  super_CatalogEntry.name);
      Value::Value((Value *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      ::std::__cxx11::string::~string(local_150);
      local_40 = (ClientContext *)((long)local_40 + 1);
      NumericCast<long,unsigned_long,void>(0x140ce8d);
      Value::BIGINT((int64_t)in_stack_fffffffffffff8d8);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      local_40 = (ClientContext *)((long)local_40 + 1);
      ::std::__cxx11::string::string
                (local_1f0,
                 (string *)
                 &(local_38->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
      Value::Value((Value *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      ::std::__cxx11::string::~string(local_1f0);
      local_40 = (ClientContext *)((long)local_40 + 1);
      index_00 = local_28;
      NumericCast<long,unsigned_long,void>(0x140cfd9);
      Value::BIGINT((int64_t)in_stack_fffffffffffff8d8);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      (*(local_38->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
        [0x10])(local_258);
      (*(local_38->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
        [0x11])(local_278);
      optional_idx::optional_idx(&local_288);
      QueryErrorContext::QueryErrorContext(&local_280,local_288);
      pTVar3 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                         ((Catalog *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
                          (string *)in_stack_fffffffffffff8a8,(string *)in_stack_fffffffffffff8a0,
                          (QueryErrorContext)in_stack_fffffffffffff8c0.index);
      ::std::__cxx11::string::~string(local_278);
      ::std::__cxx11::string::~string(local_258);
      local_40 = (ClientContext *)((long)local_40 + 1);
      local_238 = pTVar3;
      ::std::__cxx11::string::string
                (local_2e8,
                 (string *)
                 &(pTVar3->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
      Value::Value((Value *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      ::std::__cxx11::string::~string(local_2e8);
      local_40 = (ClientContext *)((long)local_40 + 1);
      NumericCast<long,unsigned_long,void>(0x140d20c);
      Value::BIGINT((int64_t)in_stack_fffffffffffff8d8);
      value = (undefined1)((ulong)in_stack_fffffffffffff8d8 >> 0x38);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      local_40 = (ClientContext *)((long)local_40 + 1);
      Value::Value((Value *)in_stack_fffffffffffff8b0,(Value *)in_stack_fffffffffffff8a8);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      local_40 = (ClientContext *)((long)local_40 + 1);
      this_00 = local_3a8;
      in_stack_fffffffffffff920 = local_18;
      Value::MAP(in_stack_fffffffffffffbb8);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      local_40 = (ClientContext *)((long)local_40 + 1);
      IndexCatalogEntry::IsUnique(local_38);
      in_stack_fffffffffffff918 = local_3e8;
      Value::BOOLEAN((bool)value);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      local_40 = (ClientContext *)((long)local_40 + 1);
      IndexCatalogEntry::IsPrimary(local_38);
      Value::BOOLEAN((bool)value);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      local_40 = (ClientContext *)((long)local_40 + 1);
      in_stack_fffffffffffff8d8 = local_4c8;
      in_stack_fffffffffffff8c0.index = (idx_t)local_18;
      GetIndexExpressions(index_00);
      Value::ToString_abi_cxx11_(this_00);
      Value::Value((Value *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      ::std::__cxx11::string::~string(local_488);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      (*(local_38->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
        [10])(local_568 + 0x80);
      in_stack_fffffffffffff8a8 = local_18;
      in_stack_fffffffffffff8b0 = local_40;
      in_stack_fffffffffffff8b8 = local_28;
      local_40 = (ClientContext *)
                 ((long)&(local_40->super_enable_shared_from_this<duckdb::ClientContext>).
                         __weak_this_.internal.
                         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 + 1);
      uVar4 = ::std::__cxx11::string::empty();
      local_568[0x27] = 0;
      local_569 = (uVar4 & 1) != 0;
      if (local_569) {
        LogicalType::LogicalType
                  ((LogicalType *)in_stack_fffffffffffff8c0.index,
                   (LogicalTypeId)((ulong)in_stack_fffffffffffff8b8 >> 0x38));
        local_568[0x27] = 1;
        Value::Value((Value *)in_stack_fffffffffffff8b0,(LogicalType *)in_stack_fffffffffffff8a8);
      }
      else {
        in_stack_fffffffffffff8a0 = (CatalogEntry *)local_568;
        ::std::__cxx11::string::string
                  ((string *)in_stack_fffffffffffff8a0,(string *)(local_568 + 0x80));
        Value::Value((Value *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
      }
      local_569 = !local_569;
      DataChunk::SetValue((DataChunk *)in_stack_fffffffffffff8b0,(idx_t)in_stack_fffffffffffff8a8,
                          (idx_t)in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
      Value::~Value((Value *)in_stack_fffffffffffff8a0);
      if (local_569) {
        ::std::__cxx11::string::~string((string *)local_568);
      }
      if ((local_568[0x27] & 1) != 0) {
        LogicalType::~LogicalType((LogicalType *)0x140d66b);
      }
      local_28 = (IndexCatalogEntry *)
                 ((long)&(local_28->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                         _vptr_CatalogEntry + 1);
      ::std::__cxx11::string::~string((string *)(local_568 + 0x80));
    }
    DataChunk::SetCardinality(local_18,(idx_t)local_28);
  }
  return;
}

Assistant:

void DuckDBIndexesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBIndexesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++].get();

		auto &index = entry.Cast<IndexCatalogEntry>();
		// return values:

		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, count, index.catalog.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(index.catalog.GetOid())));
		// schema_name, VARCHAR
		output.SetValue(col++, count, Value(index.schema.name));
		// schema_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(index.schema.oid)));
		// index_name, VARCHAR
		output.SetValue(col++, count, Value(index.name));
		// index_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(index.oid)));
		// find the table in the catalog
		auto &table_entry =
		    index.schema.catalog.GetEntry<TableCatalogEntry>(context, index.GetSchemaName(), index.GetTableName());
		// table_name, VARCHAR
		output.SetValue(col++, count, Value(table_entry.name));
		// table_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table_entry.oid)));
		// comment, VARCHAR
		output.SetValue(col++, count, Value(index.comment));
		// tags, MAP
		output.SetValue(col++, count, Value::MAP(index.tags));
		// is_unique, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(index.IsUnique()));
		// is_primary, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(index.IsPrimary()));
		// expressions, VARCHAR
		output.SetValue(col++, count, GetIndexExpressions(index).ToString());
		// sql, VARCHAR
		auto sql = index.ToSQL();
		output.SetValue(col++, count, sql.empty() ? Value() : Value(std::move(sql)));

		count++;
	}
	output.SetCardinality(count);
}